

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined7 uVar6;
  undefined8 extraout_RAX;
  uint *puVar7;
  uint *puVar8;
  double dVar9;
  string subfolder;
  string alct_outFile;
  string parquet_outFile;
  sigaction sa;
  aalcalc a;
  allocator local_465;
  float local_464;
  ulong local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  ulong local_440;
  string local_438;
  string local_418;
  undefined1 *local_3f8;
  char *local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  char *local_3d0;
  undefined1 local_3c8 [16];
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  sigaction local_318;
  aalcalc local_280;
  
  progname = *argv;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  puVar7 = (uint *)0x0;
  local_438._M_string_length = 0;
  local_438.field_2._M_local_buf[0] = '\0';
  local_3d8 = local_3c8;
  local_3d0 = (char *)0x0;
  local_3c8[0] = 0;
  local_3f8 = local_3e8;
  local_3f0 = (char *)0x0;
  local_460 = 0;
  local_3e8[0] = 0;
  local_464 = 0.95;
  local_450 = 0;
  local_448 = 0;
  local_440 = 0;
  local_458 = 0;
  do {
    while( true ) {
      while( true ) {
        iVar5 = getopt(argc,argv,"svdohK:p:c:l:");
        pcVar4 = local_3d0;
        pcVar3 = local_3f0;
        sVar2 = local_438._M_string_length;
        puVar8 = _optarg;
        if (iVar5 != 0x4b) break;
        strlen((char *)_optarg);
        std::__cxx11::string::_M_replace((ulong)&local_438,0,(char *)sVar2,(ulong)puVar8);
        puVar7 = puVar8;
      }
      if (iVar5 < 0x6c) break;
      puVar7 = &switchD_00106c36::switchdataD_00109554;
      uVar6 = (undefined7)
              ((ulong)((long)&switchD_00106c36::switchdataD_00109554 +
                      (long)(int)(&switchD_00106c36::switchdataD_00109554)[iVar5 - 0x6c]) >> 8);
      switch(iVar5) {
      case 0x6c:
        dVar9 = atof((char *)_optarg);
        local_464 = (float)dVar9;
        break;
      default:
        goto switchD_00106c36_caseD_6d;
      case 0x6f:
        local_448 = CONCAT71(uVar6,1);
        break;
      case 0x70:
        strlen((char *)_optarg);
        local_440 = CONCAT71((int7)((ulong)puVar7 >> 8),1);
        std::__cxx11::string::_M_replace((ulong)&local_3d8,0,pcVar4,(ulong)puVar8);
        puVar7 = puVar8;
        break;
      case 0x73:
        local_450 = CONCAT71(uVar6,1);
        break;
      case 0x76:
        main_cold_1();
switchD_00106c36_caseD_6d:
        main_cold_6();
LAB_0010703d:
        main_cold_5();
LAB_00107042:
        main_cold_4();
LAB_00107047:
        main_cold_3();
        if (local_3f8 != local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_3d8 != local_3c8) {
          operator_delete(local_3d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        _Unwind_Resume(extraout_RAX);
      }
    }
    if (iVar5 == -1) {
      if ((char *)local_438._M_string_length == (char *)0x0) goto LAB_0010703d;
      if ((local_464 < 0.0) || (1.0 < local_464)) goto LAB_00107042;
      if ((local_440 & 1) == 0) {
        memset(&local_318,0,0x98);
        sigemptyset(&local_318.sa_mask);
        local_318.__sigaction_handler.sa_handler = segfault_sigaction;
        local_318.sa_flags = 4;
        sigaction(0xb,&local_318,(sigaction *)0x0);
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"");
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"");
        initstreams(&local_358,&local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,local_3d8,local_3d0 + (long)local_3d8);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,local_3f8,local_3f0 + (long)local_3f8);
        aalcalc::aalcalc(&local_280,(bool)((byte)local_450 & 1),(bool)((byte)local_448 & 1),false,
                         &local_398,(bool)((byte)local_458 & 1),&local_338,local_464);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
        if ((local_460 & 1) != 0) {
          aalcalc::debug(&local_280,&local_438);
        }
        std::__cxx11::string::string((string *)&local_3b8,progname,&local_465);
        paVar1 = &local_418.field_2;
        local_418._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"INFO","");
        logprintf(&local_3b8,&local_418,"starting process..\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar1) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p);
        }
        aalcalc::doit(&local_280,&local_438);
        std::__cxx11::string::string((string *)&local_3b8,progname,&local_465);
        local_418._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"INFO","");
        logprintf(&local_3b8,&local_418,"finishing process..\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != paVar1) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p);
        }
        aalcalc::~aalcalc(&local_280);
        if (local_3f8 != local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_3d8 != local_3c8) {
          operator_delete(local_3d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        return 0;
      }
      goto LAB_00107047;
    }
    if (iVar5 == 99) {
      strlen((char *)_optarg);
      local_458 = CONCAT71((int7)((ulong)puVar7 >> 8),1);
      std::__cxx11::string::_M_replace((ulong)&local_3f8,0,pcVar3,(ulong)puVar8);
      puVar7 = puVar8;
    }
    else {
      if (iVar5 != 100) goto switchD_00106c36_caseD_6d;
      local_460 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	std::string subfolder;
	int opt;
	bool debug = false;
	bool skipheader = false;
	bool ord_output = false;   // csv output
	std::string parquet_outFile;   // parquet output
	bool parquet_output = false;   // parquet output
	std::string alct_outFile;   // Average Loss Convergence Table (ALCT)
	bool alct_output = false;   // ALCT
	float confidence_level = 0.95;
	while ((opt = getopt(argc, argv, (char *)"svdohK:p:c:l:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 's':
			skipheader = true;
			break;
		case 'K':
			subfolder = optarg;
			break;
		case 'o':
			ord_output = true;
			break;
		case 'p':
			parquet_output = true;
			parquet_outFile = optarg;
			break;
		case 'c':
			alct_output = true;
			alct_outFile = optarg;
			break;
		case 'l':
			confidence_level = atof(optarg);
			break;
		case 'd':
			debug = true;			
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

	if (subfolder.length() == 0) {
		fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
		exit(EXIT_FAILURE);
	}

	if (confidence_level < 0.0 || confidence_level > 1.0) {
		fprintf(stderr, "FATAL: Confidence level must lie between 0 and 1\n");
		exit(EXIT_FAILURE);
	}

#ifndef HAVE_PARQUET
	if (parquet_output) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet output are missing.\n"
				"Please install libraries and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	initstreams();

	
	try {
		aalcalc a(skipheader, ord_output, parquet_output,
			  parquet_outFile, alct_output, alct_outFile,
			  confidence_level);
		if (debug == true) {
			a.debug(subfolder);
		}
        	logprintf(progname, "INFO", "starting process..\n");
        	a.doit(subfolder);
        	logprintf(progname, "INFO", "finishing process..\n");
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}


	return EXIT_SUCCESS;

}